

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ClassDeclarationSyntax * __thiscall
slang::parsing::Parser::parseClassDeclaration
          (Parser *this,AttrList attributes,Token virtualOrInterface)

{
  Token openParen_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token keyword;
  Token closeParen;
  SourceRange range;
  Token classKeyword_00;
  string_view arg;
  string_view arg_00;
  Token virtualOrInterface_00;
  Token name_00;
  Token endClass_00;
  bool bVar1;
  NamedBlockClauseSyntax *pNVar2;
  ClassDeclarationSyntax *pCVar3;
  short in_CX;
  long in_RDI;
  Token TVar4;
  Token TVar5;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> sVar6;
  ClassDeclarationSyntax *result;
  NamedBlockClauseSyntax *endBlockName;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token endClass;
  Token defaultKeyword;
  Token openParen;
  DefaultExtendsClauseArgSyntax *defaultedArg;
  ArgumentListSyntax *arguments;
  NameSyntax *baseName;
  Token extends;
  ImplementsClauseSyntax *implementsClause;
  ExtendsClauseSyntax *extendsClause;
  Token semi;
  ParameterPortListSyntax *parameterList;
  Token name;
  Token next;
  ClassSpecifierSyntax *finalSpecifier;
  bool isIfaceClass;
  Token classKeyword;
  ParserBase *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 uVar7;
  uint32_t in_stack_fffffffffffffc74;
  uint32_t uVar8;
  undefined6 in_stack_fffffffffffffc78;
  TokenKind in_stack_fffffffffffffc7e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc80;
  ParserBase *in_stack_fffffffffffffc88;
  SourceLocation in_stack_fffffffffffffc90;
  SourceLocation in_stack_fffffffffffffc98;
  Parser *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  Diagnostic *in_stack_fffffffffffffcb0;
  size_t in_stack_fffffffffffffcb8;
  SyntaxNode *in_stack_fffffffffffffcc0;
  Parser *in_stack_fffffffffffffcc8;
  ParserBase *in_stack_fffffffffffffcd0;
  SourceLocation in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce0;
  DiagCode code;
  ClassSpecifierSyntax *in_stack_fffffffffffffcf0;
  TokenKind in_stack_fffffffffffffcfe;
  ParserBase *in_stack_fffffffffffffd00;
  __extent_storage<18446744073709551615UL> extendsClause_00;
  ImplementsClauseSyntax *in_stack_fffffffffffffd18;
  Token in_stack_fffffffffffffd20;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_fffffffffffffd30;
  Parser *in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd40;
  _Optional_payload_base<slang::DiagCode> in_stack_fffffffffffffd42;
  NamedBlockClauseSyntax *in_stack_fffffffffffffd48;
  Parser *in_stack_fffffffffffffd68;
  ParameterPortListSyntax *local_1f0;
  undefined6 local_1e0;
  TokenKind in_stack_fffffffffffffe26;
  Parser *in_stack_fffffffffffffe28;
  SourceRange in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe68 [16];
  unkbyte10 Var9;
  TokenKind local_148;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_100;
  SyntaxFactory *local_f8;
  TokenKind local_88;
  ClassSpecifierSyntax *local_78;
  
  Var9 = in_stack_fffffffffffffe68._6_10_;
  code = SUB84((ulong)in_stack_fffffffffffffce0 >> 0x20,0);
  ParserBase::consume((ParserBase *)in_stack_fffffffffffffc90);
  local_78 = (ClassSpecifierSyntax *)0x0;
  if (in_CX != 200) {
    TVar4 = ParserBase::peek(in_stack_fffffffffffffc68);
    local_88 = TVar4.kind;
    if ((local_88 == StaticKeyword) || (local_88 == AutomaticKeyword)) {
      if (*(int *)(in_RDI + 0xf4) < 1) {
        std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)0x5d5154);
        ParserBase::skipToken
                  (&in_stack_fffffffffffffd38->super_ParserBase,
                   (optional<slang::DiagCode>)in_stack_fffffffffffffd42);
      }
      else {
        std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
                  ((optional<slang::DiagCode> *)
                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   (DiagCode *)in_stack_fffffffffffffc68);
        ParserBase::skipToken
                  (&in_stack_fffffffffffffd38->super_ParserBase,
                   (optional<slang::DiagCode>)in_stack_fffffffffffffd42);
      }
      ParserBase::peek(in_stack_fffffffffffffc68);
    }
    local_78 = parseClassSpecifier(in_stack_fffffffffffffd38);
    if (((local_78 != (ClassSpecifierSyntax *)0x0) &&
        (bVar1 = Token::operator_cast_to_bool((Token *)0x5d5260), bVar1)) &&
       ((local_78->keyword).kind != FinalKeyword)) {
      Token::location(&local_78->keyword);
      ParserBase::addDiag(in_stack_fffffffffffffcd0,code,in_stack_fffffffffffffcd8);
      sv((char *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
         (size_t)in_stack_fffffffffffffc68);
      arg._M_str = (char *)in_stack_fffffffffffffcc0;
      arg._M_len = in_stack_fffffffffffffcb8;
      Diagnostic::operator<<(in_stack_fffffffffffffcb0,arg);
    }
  }
  TVar4 = ParserBase::expect(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfe);
  parseParameterPortList(in_stack_fffffffffffffd68);
  Token::Token((Token *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  if (in_CX != 200) {
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc80._M_extent_value,
                             in_stack_fffffffffffffc7e);
    if (bVar1) {
      ParserBase::consume((ParserBase *)in_stack_fffffffffffffc90);
      parseName((Parser *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc80._M_extent_value,
                               in_stack_fffffffffffffc7e);
      if (bVar1) {
        TVar5 = ParserBase::peek((ParserBase *)
                                 CONCAT26(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78),
                                 in_stack_fffffffffffffc74);
        local_148 = TVar5.kind;
        if (local_148 == DefaultKeyword) {
          ParserBase::consume((ParserBase *)in_stack_fffffffffffffc90);
          ParserBase::consume((ParserBase *)in_stack_fffffffffffffc90);
          TVar5 = ParserBase::expect(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfe);
          in_stack_fffffffffffffc68 = TVar5._0_8_;
          in_stack_fffffffffffffc70 = TVar5.info._0_4_;
          in_stack_fffffffffffffc74 = TVar5.info._4_4_;
          openParen_00.rawLen._2_2_ = in_stack_fffffffffffffc7e;
          openParen_00._0_6_ = in_stack_fffffffffffffc78;
          openParen_00.info = (Info *)in_stack_fffffffffffffc80._M_extent_value;
          closeParen.info = (Info *)in_stack_fffffffffffffc98;
          closeParen._0_8_ = in_stack_fffffffffffffc90;
          slang::syntax::SyntaxFactory::defaultExtendsClauseArg
                    ((SyntaxFactory *)0x5d552c,openParen_00,TVar5,closeParen);
          Var9 = TVar5._6_10_;
          if (*(int *)(in_RDI + 0xf4) < 1) {
            in_stack_fffffffffffffe64 = 0x20001;
            in_stack_fffffffffffffe50 =
                 slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffcc0);
            range.endLoc = in_stack_fffffffffffffc98;
            range.startLoc = in_stack_fffffffffffffc90;
            ParserBase::addDiag(in_stack_fffffffffffffc88,
                                SUB84((ulong)in_stack_fffffffffffffca0 >> 0x20,0),range);
            slang::toString(Default);
            arg_00._M_str = (char *)in_stack_fffffffffffffcc0;
            arg_00._M_len = in_stack_fffffffffffffcb8;
            Diagnostic::operator<<(in_stack_fffffffffffffcb0,arg_00);
          }
        }
        else {
          parseArgumentList((Parser *)CONCAT62(in_stack_fffffffffffffd42,in_stack_fffffffffffffd40))
          ;
        }
      }
      keyword.info = (Info *)in_stack_fffffffffffffc90;
      keyword._0_8_ = in_stack_fffffffffffffc88;
      slang::syntax::SyntaxFactory::extendsClause
                ((SyntaxFactory *)in_stack_fffffffffffffc80._M_extent_value,keyword,
                 (NameSyntax *)CONCAT26(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78),
                 (ArgumentListSyntax *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)
                 ,(DefaultExtendsClauseArgSyntax *)in_stack_fffffffffffffc68);
    }
    parseImplementsClause(in_stack_fffffffffffffe28,in_stack_fffffffffffffe26,(Token *)local_1f0);
  }
  else {
    parseImplementsClause(in_stack_fffffffffffffe28,in_stack_fffffffffffffe26,(Token *)local_1f0);
  }
  Token::Token((Token *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  sVar6 = parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseClassDeclaration(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token)::__0>
                    ((Parser *)((unkuint10)Var9 >> 0x10),(TokenKind)Var9,
                     (Token *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe50.endLoc._4_4_,
                     (anon_class_24_3_d68eb3d1 *)in_stack_fffffffffffffe50.startLoc);
  pNVar2 = parseNamedBlockClause(in_stack_fffffffffffffcc8);
  TVar5.info = (Info *)in_stack_fffffffffffffcb0;
  TVar5.kind = (short)in_stack_fffffffffffffca8;
  TVar5._2_1_ = (char)((ulong)in_stack_fffffffffffffca8 >> 0x10);
  TVar5.numFlags.raw = (char)((ulong)in_stack_fffffffffffffca8 >> 0x18);
  TVar5.rawLen = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  checkBlockNames(in_stack_fffffffffffffca0,TVar5,
                  (NamedBlockClauseSyntax *)in_stack_fffffffffffffc98);
  elements._M_ptr._6_2_ = in_stack_fffffffffffffc7e;
  elements._M_ptr._0_6_ = in_stack_fffffffffffffc78;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffc80._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),elements);
  local_1f0 = (ParameterPortListSyntax *)sVar6._M_ptr;
  extendsClause_00 = sVar6._M_extent._M_extent_value;
  sVar6._M_ptr._6_2_ = in_stack_fffffffffffffc7e;
  sVar6._M_ptr._0_6_ = in_stack_fffffffffffffc78;
  sVar6._M_extent._M_extent_value = in_stack_fffffffffffffc80._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::MemberSyntax> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),sVar6);
  uVar7 = TVar4._0_4_;
  uVar8 = TVar4.rawLen;
  classKeyword_00.info._6_2_ = in_stack_fffffffffffffe26;
  classKeyword_00.info._0_6_ = local_1e0;
  virtualOrInterface_00.info = (Info *)pNVar2;
  virtualOrInterface_00._0_8_ = in_stack_fffffffffffffe28;
  classKeyword_00._0_8_ = &stack0xfffffffffffffd18;
  name_00.rawLen._2_2_ = in_stack_fffffffffffffe26;
  name_00._0_6_ = local_1e0;
  name_00.info = (Info *)in_stack_fffffffffffffe28;
  endClass_00.info._0_2_ = in_stack_fffffffffffffd40;
  endClass_00._0_8_ = in_stack_fffffffffffffd38;
  endClass_00.info._2_6_ = in_stack_fffffffffffffd42;
  pCVar3 = slang::syntax::SyntaxFactory::classDeclaration
                     (local_f8,local_100,virtualOrInterface_00,classKeyword_00,
                      in_stack_fffffffffffffcf0,name_00,local_1f0,
                      (ExtendsClauseSyntax *)extendsClause_00._M_extent_value,
                      in_stack_fffffffffffffd18,in_stack_fffffffffffffd20,in_stack_fffffffffffffd30,
                      endClass_00,in_stack_fffffffffffffd48);
  std::
  vector<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ::push_back((vector<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
               *)CONCAT44(uVar8,uVar7),(value_type *)local_78);
  return pCVar3;
}

Assistant:

ClassDeclarationSyntax& Parser::parseClassDeclaration(AttrList attributes,
                                                      Token virtualOrInterface) {
    auto classKeyword = consume();

    const bool isIfaceClass = virtualOrInterface.kind == TokenKind::InterfaceKeyword;
    ClassSpecifierSyntax* finalSpecifier = nullptr;
    if (!isIfaceClass) {
        auto next = peek();
        if (next.kind == TokenKind::StaticKeyword || next.kind == TokenKind::AutomaticKeyword) {
            // This was allowed in 1800-2017 but did nothing, so silently skip it.
            // It was removed in 1800-2023 so issue an error.
            if (parseOptions.languageVersion < LanguageVersion::v1800_2023)
                skipToken({});
            else
                skipToken(diag::ExpectedIdentifier);
            next = peek();
        }

        finalSpecifier = parseClassSpecifier();
        if (finalSpecifier && finalSpecifier->keyword &&
            finalSpecifier->keyword.kind != TokenKind::FinalKeyword) {
            addDiag(diag::ExpectedToken, finalSpecifier->keyword.location()) << "final"sv;
        }
    }

    auto name = expect(TokenKind::Identifier);
    auto parameterList = parseParameterPortList();

    Token semi;
    ExtendsClauseSyntax* extendsClause = nullptr;
    ImplementsClauseSyntax* implementsClause = nullptr;

    // interface classes treat "extends" as the implements list
    if (isIfaceClass) {
        implementsClause = parseImplementsClause(TokenKind::ExtendsKeyword, semi);
    }
    else {
        if (peek(TokenKind::ExtendsKeyword)) {
            auto extends = consume();
            auto& baseName = parseName();

            ArgumentListSyntax* arguments = nullptr;
            DefaultExtendsClauseArgSyntax* defaultedArg = nullptr;
            if (peek(TokenKind::OpenParenthesis)) {
                if (peek(1).kind == TokenKind::DefaultKeyword) {
                    auto openParen = consume();
                    auto defaultKeyword = consume();
                    defaultedArg = &factory.defaultExtendsClauseArg(
                        openParen, defaultKeyword, expect(TokenKind::CloseParenthesis));

                    if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
                        addDiag(diag::WrongLanguageVersion, defaultedArg->sourceRange())
                            << toString(parseOptions.languageVersion);
                    }
                }
                else {
                    arguments = &parseArgumentList();
                }
            }

            extendsClause = &factory.extendsClause(extends, baseName, arguments, defaultedArg);
        }
        implementsClause = parseImplementsClause(TokenKind::ImplementsKeyword, semi);
    }

    Token endClass;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndClassKeyword, endClass, SyntaxKind::ClassDeclaration,
        [this, isIfaceClass, extendsClause](SyntaxKind, bool&) {
            return parseClassMember(isIfaceClass, extendsClause != nullptr);
        });

    auto endBlockName = parseNamedBlockClause();
    checkBlockNames(name, endBlockName);

    auto& result = factory.classDeclaration(attributes, virtualOrInterface, classKeyword,
                                            finalSpecifier, name, parameterList, extendsClause,
                                            implementsClause, semi, members, endClass,
                                            endBlockName);
    meta.classDecls.push_back(&result);
    return result;
}